

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O3

Data2D<int> * __thiscall
TasGrid::GridLocalPolynomial::buildUpdateMap<(TasGrid::RuleLocal::erule)0>
          (Data2D<int> *__return_storage_ptr__,GridLocalPolynomial *this,double tolerance,
          TypeRefinement criteria,int output,double *scale_correction)

{
  MultiIndexSet *mset;
  int iVar1;
  int iVar2;
  int iVar3;
  pointer pdVar4;
  size_t sVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  _Bit_type *p_Var9;
  int iVar10;
  int *piVar11;
  ulong uVar12;
  size_t sVar13;
  bool bVar14;
  uint uVar15;
  int iVar16;
  size_type sVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  pointer pdVar21;
  long lVar22;
  _Bit_type *__first_p;
  ulong *puVar23;
  long lVar24;
  long lVar25;
  uint uVar26;
  long lVar27;
  size_type __n;
  pointer piVar28;
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar33;
  undefined1 auVar32 [16];
  Data2D<double> vals;
  vector<int,_std::allocator<int>_> monkey_tail;
  vector<int,_std::allocator<int>_> global_to_pnts;
  vector<int,_std::allocator<int>_> monkey_count;
  vector<int,_std::allocator<int>_> levels;
  vector<double,_std::allocator<double>_> norm;
  SplitDirections split;
  Data2D<int> dagUp;
  int local_22c;
  allocator_type local_209;
  long local_208;
  ulong local_200;
  double *local_1f8;
  uint local_1ec;
  uint local_1e8;
  int local_1e4;
  double *local_1e0;
  ulong local_1d8;
  pointer local_1d0;
  pointer local_1c8;
  double *local_1c0;
  long local_1b8;
  ulong local_1b0;
  vector<bool,_std::allocator<bool>_> local_1a8;
  ulong local_180;
  long local_178;
  vector<double,_std::allocator<double>_> local_170;
  vector<int,_std::allocator<int>_> local_158;
  long local_140;
  size_t local_138;
  ulong local_130;
  long local_128;
  vector<int,_std::allocator<int>_> local_120;
  vector<int,_std::allocator<int>_> local_108;
  vector<int,_std::allocator<int>_> local_e8;
  vector<double,_std::allocator<double>_> local_d0;
  SplitDirections local_b8;
  Data2D<int> *local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  double local_60;
  Data2D<int> local_58;
  
  local_200 = CONCAT44(local_200._4_4_,criteria);
  iVar10 = (this->super_BaseCanonicalGrid).points.cache_num_indexes;
  __n = (size_type)iVar10;
  sVar13 = (size_t)(this->super_BaseCanonicalGrid).num_dimensions;
  local_58.stride = CONCAT44(local_58.stride._4_4_,-(uint)(tolerance == 0.0)) & 0xffffffff00000001;
  local_1e0 = scale_correction;
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_b8.job_directions,sVar13 * __n,(value_type_conflict3 *)&local_58,
             (allocator_type *)&local_1a8);
  piVar28 = local_b8.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  __return_storage_ptr__->stride = sVar13;
  __return_storage_ptr__->num_strips = __n;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_b8.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_b8.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_b8.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  if ((tolerance != 0.0) || (NAN(tolerance))) {
    local_138 = sVar13;
    getNormalization(&local_d0,this);
    local_1e8 = 1;
    if (output == -1) {
      local_1e8 = (this->super_BaseCanonicalGrid).num_outputs;
    }
    local_1d8 = (ulong)(int)local_1e8;
    local_1c8 = (pointer)0x0;
    local_1c0 = (double *)0x0;
    if (local_1e0 == (double *)0x0) {
      local_58.stride = 0x3ff0000000000000;
      ::std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_b8,local_1d8 * __n,
                 (value_type_conflict2 *)&local_58,(allocator_type *)&local_1a8);
      local_1c8 = local_b8.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      local_1c0 = (double *)
                  local_b8.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_1e0 = (double *)
                  local_b8.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    auVar8 = _DAT_001ca0b0;
    auVar7 = _DAT_001ca070;
    auVar6 = _DAT_001ca060;
    local_88 = __return_storage_ptr__;
    if ((uint)local_200 < 2) {
      if (0 < iVar10) {
        sVar13 = (this->surpluses).stride;
        pdVar4 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar28 = (pointer)((long)piVar28 + 0xc);
        sVar17 = 0;
        do {
          lVar18 = sVar13 * sVar17;
          if (output == -1) {
            lVar22 = (long)(this->super_BaseCanonicalGrid).num_outputs;
            if (0 < lVar22) {
              bVar14 = true;
              lVar27 = 0;
              do {
                while (bVar14) {
                  dVar29 = (ABS(pdVar4[lVar18 + lVar27]) * (local_1e0 + sVar17 * local_1d8)[lVar27])
                           / local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar27];
                  bVar14 = dVar29 <= tolerance;
                  lVar27 = lVar27 + 1;
                  if (lVar27 == lVar22) goto LAB_001a0e84;
                }
                lVar27 = lVar27 + 1;
                bVar14 = false;
              } while (lVar27 != lVar22);
              goto LAB_001a0eeb;
            }
          }
          else {
            dVar29 = (ABS(pdVar4[lVar18 + output]) * local_1e0[sVar17 * local_1d8]) /
                     local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[output];
LAB_001a0e84:
            if (tolerance < dVar29) {
LAB_001a0eeb:
              lVar18 = (long)(this->super_BaseCanonicalGrid).num_dimensions;
              if (0 < lVar18) {
                uVar19 = lVar18 + 0x3fffffffffffffff;
                uVar20 = uVar19 & 0x3fffffffffffffff;
                auVar30._8_4_ = (int)uVar20;
                auVar30._0_8_ = uVar20;
                auVar30._12_4_ = (int)(uVar20 >> 0x20);
                auVar30 = auVar30 ^ auVar6;
                lVar18 = 0;
                do {
                  auVar31._8_4_ = (int)lVar18;
                  auVar31._0_8_ = lVar18;
                  auVar31._12_4_ = (int)((ulong)lVar18 >> 0x20);
                  auVar32 = (auVar31 | auVar7) ^ auVar6;
                  iVar10 = auVar30._4_4_;
                  if ((bool)(~(iVar10 < auVar32._4_4_ ||
                              auVar30._0_4_ < auVar32._0_4_ && auVar32._4_4_ == iVar10) & 1)) {
                    piVar28[lVar18 + -3] = 1;
                  }
                  if (auVar32._12_4_ <= auVar30._12_4_ &&
                      (auVar32._8_4_ <= auVar30._8_4_ || auVar32._12_4_ != auVar30._12_4_)) {
                    piVar28[lVar18 + -2] = 1;
                  }
                  auVar31 = (auVar31 | auVar8) ^ auVar6;
                  iVar33 = auVar31._4_4_;
                  if (iVar33 <= iVar10 && (iVar33 != iVar10 || auVar31._0_4_ <= auVar30._0_4_)) {
                    piVar28[lVar18 + -1] = 1;
                    piVar28[lVar18] = 1;
                  }
                  lVar18 = lVar18 + 4;
                } while ((uVar20 - ((uint)uVar19 & 3)) + 4 != lVar18);
              }
            }
          }
          sVar17 = sVar17 + 1;
          piVar28 = piVar28 + local_138;
        } while (sVar17 != __n);
      }
    }
    else {
      mset = &(this->super_BaseCanonicalGrid).points;
      HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)0>(&local_58,mset);
      HierarchyManipulations::SplitDirections::SplitDirections(&local_b8,mset);
      iVar10 = HierarchyManipulations::SplitDirections::getMaxNumPoints(&local_b8);
      ::std::vector<int,_std::allocator<int>_>::vector(&local_120,__n,(allocator_type *)&local_1a8);
      ::std::vector<int,_std::allocator<int>_>::vector
                (&local_e8,(long)iVar10,(allocator_type *)&local_1a8);
      local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (int *)0x0;
      local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (int *)0x0;
      local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (ulong *)0x0;
      local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_offset = 0;
      local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
      ::std::vector<int,_std::allocator<int>_>::resize(&local_108,(long)this->top_level + 1);
      ::std::vector<int,_std::allocator<int>_>::resize(&local_158,(long)this->top_level + 1);
      std::vector<bool,_std::allocator<bool>_>::resize(&local_1a8,(long)iVar10,false);
      if (0 < (int)((ulong)((long)local_b8.job_pnts.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_b8.job_pnts.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
        local_140 = (long)output;
        local_68 = (ulong)local_1e8;
        lVar18 = 0;
        local_1f8 = (double *)piVar28;
        do {
          local_208 = (long)*(int *)((long)local_b8.job_directions.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_start + lVar18 * 4);
          local_1d0 = local_b8.job_pnts.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar18].
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start;
          uVar19 = (ulong)((long)local_b8.job_pnts.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar18].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)local_1d0) >> 2;
          local_180 = local_1d8;
          uVar26 = (uint)uVar19;
          local_178 = (long)(int)uVar26;
          ::std::vector<double,_std::allocator<double>_>::vector
                    (&local_170,local_178 * local_1d8,&local_209);
          local_130 = uVar19;
          if (output == -1) {
            if (0 < (int)uVar26) {
              uVar19 = 0;
              local_22c = 0;
              local_1b8 = lVar18;
              do {
                piVar28 = local_1d0;
                lVar18 = (long)(this->super_BaseCanonicalGrid).num_outputs;
                if (0 < lVar18) {
                  memmove(local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + local_180 * uVar19,
                          (this->super_BaseCanonicalGrid).values.values.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start +
                          (long)local_1d0[uVar19] *
                          (this->super_BaseCanonicalGrid).values.num_outputs,lVar18 << 3);
                }
                local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[piVar28[uVar19]] = (int)uVar19;
                uVar15 = (this->super_BaseCanonicalGrid).points.indexes.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start
                         [(long)piVar28[uVar19] *
                          (this->super_BaseCanonicalGrid).points.num_dimensions + local_208];
                iVar10 = 0;
                if (0 < (int)uVar15) {
                  do {
                    iVar10 = iVar10 + 1;
                    bVar14 = 2 < uVar15;
                    uVar15 = uVar15 / 3;
                  } while (bVar14);
                }
                local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar19] = iVar10;
                if (local_22c <= iVar10) {
                  local_22c = iVar10;
                }
                uVar19 = uVar19 + 1;
              } while (uVar19 != (uVar26 & 0x7fffffff));
              goto LAB_001a137d;
            }
          }
          else if (0 < (int)uVar26) {
            sVar13 = (this->super_BaseCanonicalGrid).points.num_dimensions;
            pdVar4 = (this->super_BaseCanonicalGrid).values.values.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            sVar5 = (this->super_BaseCanonicalGrid).values.num_outputs;
            piVar28 = (this->super_BaseCanonicalGrid).points.indexes.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start;
            uVar19 = 0;
            local_22c = 0;
            do {
              iVar10 = local_1d0[uVar19];
              local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[local_180 * uVar19] =
                   pdVar4[local_140 + sVar5 * (long)iVar10];
              local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar10] = (int)uVar19;
              uVar15 = piVar28[local_208 + (long)local_1d0[uVar19] * sVar13];
              iVar10 = 0;
              if (0 < (int)uVar15) {
                iVar10 = 0;
                do {
                  iVar10 = iVar10 + 1;
                  bVar14 = 2 < uVar15;
                  uVar15 = uVar15 / 3;
                } while (bVar14);
              }
              local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar19] = iVar10;
              if (local_22c <= iVar10) {
                local_22c = iVar10;
              }
              uVar19 = uVar19 + 1;
              local_1b8 = lVar18;
            } while (uVar19 != (uVar26 & 0x7fffffff));
LAB_001a137d:
            uVar26 = (uint)local_130;
            if (0 < local_22c) {
              local_1e4 = (int)local_208 * 2;
              local_200 = (ulong)(uVar26 & 0x7fffffff);
              uVar15 = (uVar26 & 0x7fffffff) >> 6;
              local_80 = (ulong)uVar15;
              local_1ec = uVar26 & 0x3f;
              local_78 = (ulong)(uVar15 << 3);
              local_70 = ~(0xffffffffffffffffU >> (-(char)local_1ec & 0x3fU));
              iVar10 = (int)local_208 * 2 + 2;
              local_1b0 = 1;
              do {
                if (0 < (int)local_130) {
                  local_128 = 0;
                  uVar19 = 0;
                  do {
                    pdVar4 = local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    uVar20 = local_180;
                    p_Var9 = local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                    if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar19] == (int)local_1b0) {
                      uVar26 = (this->super_BaseCanonicalGrid).points.indexes.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start
                               [(long)local_1d0[uVar19] *
                                (this->super_BaseCanonicalGrid).points.num_dimensions + local_208];
                      dVar29 = 1.0;
                      if (0 < (int)uVar26) {
                        iVar33 = 1;
                        uVar15 = uVar26;
                        do {
                          iVar33 = iVar33 * 3;
                          bVar14 = 2 < uVar15;
                          uVar15 = uVar15 / 3;
                        } while (bVar14);
                        dVar29 = (double)iVar33;
                      }
                      local_60 = (double)(int)((uVar26 - ((int)uVar26 >> 0x1f) & 0xfffffffe) +
                                               uVar26 * 2 + 2) * (1.0 / dVar29) + -2.0;
                      *local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start = local_1e4;
                      *local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start = local_1d0[uVar19];
                      if ((uint)local_200 < 0x40) {
                        puVar23 = local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                        if (local_1ec != 0) {
LAB_001a153d:
                          *puVar23 = *puVar23 & local_70;
                        }
                      }
                      else {
                        memset(local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,0,
                               local_78);
                        if (local_1ec != 0) {
                          puVar23 = p_Var9 + local_80;
                          goto LAB_001a153d;
                        }
                      }
                      if (*local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start < iVar10) {
                        lVar18 = uVar20 * local_128;
                        iVar33 = 0;
                        piVar11 = local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start;
                        do {
                          iVar1 = piVar11[iVar33];
                          if (iVar1 < iVar10) {
                            iVar2 = local_58.vec.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start
                                    [(long)local_158.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start[iVar33] *
                                     local_58.stride + (long)iVar1];
                            lVar22 = (long)iVar2;
                            if (lVar22 != -1) {
                              iVar3 = local_120.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start[lVar22];
                              uVar20 = (ulong)iVar3;
                              iVar16 = iVar3 + 0x3f;
                              if (-1 < (long)uVar20) {
                                iVar16 = iVar3;
                              }
                              if ((local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                   [(long)(iVar16 >> 6) +
                                    ((ulong)((uVar20 & 0x800000000000003f) < 0x8000000000000001) - 1
                                    )] >> (uVar20 & 0x3f) & 1) == 0) {
                                dVar29 = RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)0>
                                                   (this->order,
                                                    (this->super_BaseCanonicalGrid).points.indexes.
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start
                                                    [(this->super_BaseCanonicalGrid).points.
                                                     num_dimensions * lVar22 + local_208],local_60);
                                iVar1 = local_120.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start[lVar22];
                                uVar20 = (ulong)iVar1;
                                if (0 < (int)local_1e8) {
                                  uVar12 = 0;
                                  do {
                                    *(double *)((long)pdVar4 + uVar12 * 8 + lVar18) =
                                         local_170.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start
                                         [local_180 * uVar20 + uVar12] * -dVar29 +
                                         *(double *)((long)pdVar4 + uVar12 * 8 + lVar18);
                                    uVar12 = uVar12 + 1;
                                  } while (local_68 != uVar12);
                                }
                                uVar12 = uVar20 + 0x3f;
                                if (-1 < (long)uVar20) {
                                  uVar12 = uVar20;
                                }
                                local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                [((long)uVar12 >> 6) +
                                 ((ulong)((uVar20 & 0x800000000000003f) < 0x8000000000000001) - 1)]
                                     = local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                       super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                       _M_p[((long)uVar12 >> 6) +
                                            ((ulong)((uVar20 & 0x800000000000003f) <
                                                    0x8000000000000001) - 1)] |
                                       1L << ((byte)iVar1 & 0x3f);
                                local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[(long)iVar33 + 1] = local_1e4;
                                local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[(long)iVar33 + 1] = iVar2;
                                piVar11 = local_108.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start;
                                iVar33 = iVar33 + 1;
                                goto LAB_001a15f7;
                              }
                            }
                            piVar11[iVar33] = iVar1 + 1;
                          }
                          else {
                            piVar11[(long)iVar33 + -1] = piVar11[(long)iVar33 + -1] + 1;
                            iVar33 = iVar33 + -1;
                          }
LAB_001a15f7:
                        } while (*piVar11 < iVar10);
                      }
                    }
                    uVar19 = uVar19 + 1;
                    local_128 = local_128 + 8;
                  } while (uVar19 != local_200);
                }
                iVar33 = (int)local_1b0;
                local_1b0 = (ulong)(iVar33 + 1);
                uVar26 = (uint)local_130;
              } while (iVar33 != local_22c);
            }
            lVar18 = local_1b8;
            if (0 < (int)uVar26) {
              sVar13 = (this->surpluses).stride;
              pdVar4 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              local_200 = local_180;
              uVar19 = 0;
              pdVar21 = local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              do {
                lVar22 = (long)local_1d0[uVar19];
                lVar27 = sVar13 * lVar22;
                if (output == -1) {
                  lVar24 = (long)(this->super_BaseCanonicalGrid).num_outputs;
                  bVar14 = true;
                  if (0 < lVar24) {
                    lVar25 = 0;
                    do {
                      if (bVar14 == false) {
                        bVar14 = false;
                      }
                      else {
                        dVar29 = (local_1e0 + lVar22 * local_1d8)[lVar25];
                        bVar14 = true;
                        if (tolerance <
                            (ABS(pdVar4[lVar27 + lVar25]) * dVar29) /
                            local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar25]) {
                          bVar14 = (dVar29 * ABS(pdVar21[lVar25])) /
                                   local_d0.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar25] <= tolerance;
                        }
                      }
                      lVar25 = lVar25 + 1;
                    } while (lVar24 != lVar25);
                  }
                }
                else {
                  dVar29 = local_1e0[lVar22 * local_1d8];
                  bVar14 = true;
                  if (tolerance <
                      (ABS(pdVar4[lVar27 + local_140]) * dVar29) /
                      local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[local_140]) {
                    bVar14 = (dVar29 * ABS(local_170.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start
                                           [local_180 * uVar19])) /
                             local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[local_140] <= tolerance;
                  }
                }
                *(uint *)((long)local_1f8 + lVar22 * local_138 * 4 + local_208 * 4) =
                     (uint)(bVar14 ^ 1);
                uVar19 = uVar19 + 1;
                pdVar21 = pdVar21 + local_180;
              } while (uVar19 != (uVar26 & 0x7fffffff));
            }
          }
          if (local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_170.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_170.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 < (int)((ulong)((long)local_b8.job_pnts.
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_b8.job_pnts.
                                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                          -0x55555555);
      }
      if (local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (ulong *)0x0) {
        operator_delete(local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (ulong *)0x0;
      }
      if (local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      HierarchyManipulations::SplitDirections::~SplitDirections(&local_b8);
      if (local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    if (local_1c0 != (double *)0x0) {
      operator_delete(local_1c0,(long)local_1c8 - (long)local_1c0);
    }
    __return_storage_ptr__ = local_88;
    if (local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Data2D<int> GridLocalPolynomial::buildUpdateMap(double tolerance, TypeRefinement criteria, int output, const double *scale_correction) const{
    int num_points = points.getNumIndexes();
    Data2D<int> pmap(num_dimensions, num_points,
                     std::vector<int>(Utils::size_mult(num_dimensions, num_points),
                                      (tolerance == 0.0) ? 1 : 0) // tolerance 0 means "refine everything"
                    );
    if (tolerance == 0.0) return pmap;

    std::vector<double> norm = getNormalization();

    int active_outputs = (output == -1) ? num_outputs : 1;
    Utils::Wrapper2D<double const> scale(active_outputs, scale_correction);
    std::vector<double> default_scale;
    if (scale_correction == nullptr){
        default_scale = std::vector<double>(Utils::size_mult(active_outputs, num_points), 1.0);
        scale = Utils::Wrapper2D<double const>(active_outputs, default_scale.data());
    }

    if ((criteria == refine_classic) || (criteria == refine_parents_first)){
        #pragma omp parallel for
        for(int i=0; i<num_points; i++){
            bool small = true;
            const double *s = surpluses.getStrip(i);
            const double *c = scale.getStrip(i);
            if (output == -1){
                for(int k=0; k<num_outputs; k++) small = small && ((c[k] * std::abs(s[k]) / norm[k]) <= tolerance);
            }else{
                small = ((c[0] * std::abs(s[output]) / norm[output]) <= tolerance);
            }
            if (!small)
                std::fill_n(pmap.getStrip(i), num_dimensions, 1);
        }
    }else{
        // construct a series of 1D interpolants and use a refinement criteria that is a combination of the two hierarchical coefficients
        Data2D<int> dagUp = HierarchyManipulations::computeDAGup<effrule>(points);

        int max_1D_parents = RuleLocal::getMaxNumParents<effrule>();

        HierarchyManipulations::SplitDirections split(points);

        #pragma omp parallel
        {
            int max_nump = split.getMaxNumPoints();
            std::vector<int> global_to_pnts(num_points);
            std::vector<int> levels(max_nump);

            std::vector<int> monkey_count;
            std::vector<int> monkey_tail;
            std::vector<bool> used;
            if (max_1D_parents > 1) {
                monkey_count.resize(top_level + 1);
                monkey_tail.resize(top_level + 1);
                used.resize(max_nump, false);
            }

            #pragma omp for
            for(int j=0; j<split.getNumJobs(); j++){ // split.getNumJobs() gives the number of 1D interpolants to construct
                int d = split.getJobDirection(j);
                int nump = split.getJobNumPoints(j);
                const int *pnts = split.getJobPoints(j);

                int max_level = 0;

                Data2D<double> vals(active_outputs, nump);

                if (output == -1) {
                    for(int i=0; i<nump; i++){
                        std::copy_n(values.getValues(pnts[i]), num_outputs, vals.getStrip(i));
                        global_to_pnts[pnts[i]] = i;
                        levels[i] = RuleLocal::getLevel<effrule>(points.getIndex(pnts[i])[d]);
                        if (max_level < levels[i]) max_level = levels[i];
                    }
                } else {
                    for(int i=0; i<nump; i++){
                        vals.getStrip(i)[0] = values.getValues(pnts[i])[output];
                        global_to_pnts[pnts[i]] = i;
                        levels[i] = RuleLocal::getLevel<effrule>(points.getIndex(pnts[i])[d]);
                        if (max_level < levels[i]) max_level = levels[i];
                    }
                }

                if (max_1D_parents == 1) {
                    for(int l=1; l<=max_level; l++){
                        for(int i=0; i<nump; i++){
                            if (levels[i] == l){
                                double x = RuleLocal::getNode<effrule>(points.getIndex(pnts[i])[d]);
                                double *valsi = vals.getStrip(i);

                                int branch = dagUp.getStrip(pnts[i])[d];
                                while(branch != -1) {
                                    const int *branch_point = points.getIndex(branch);
                                    double basis_value = RuleLocal::evalRaw<effrule>(order, branch_point[d], x);
                                    const double *branch_vals = vals.getStrip(global_to_pnts[branch]);
                                    for(int k=0; k<active_outputs; k++) valsi[k] -= basis_value * branch_vals[k];
                                    branch = dagUp.getStrip(branch)[d];
                                }
                            }
                        }
                    }
                } else {
                    for(int l=1; l<=max_level; l++){
                        for(int i=0; i<nump; i++){
                            if (levels[i] == l){
                                double x = RuleLocal::getNode<effrule>(points.getIndex(pnts[i])[d]);
                                double *valsi = vals.getStrip(i);

                                int current = 0;
                                monkey_count[0] = d * max_1D_parents;
                                monkey_tail[0] = pnts[i]; // uses the global indexes
                                std::fill_n(used.begin(), nump, false);

                                while(monkey_count[0] < (d+1) * max_1D_parents){
                                    if (monkey_count[current] < (d+1) * max_1D_parents){
                                        int branch = dagUp.getStrip(monkey_tail[current])[monkey_count[current]];
                                        if ((branch == -1) || (used[global_to_pnts[branch]])){
                                            monkey_count[current]++;
                                        }else{
                                            const int *branch_point = points.getIndex(branch);
                                            double basis_value = RuleLocal::evalRaw<effrule>(order, branch_point[d], x);
                                            const double *branch_vals = vals.getStrip(global_to_pnts[branch]);
                                            for(int k=0; k<active_outputs; k++) valsi[k] -= basis_value * branch_vals[k];

                                            used[global_to_pnts[branch]] = true;
                                            monkey_count[++current] = d * max_1D_parents;
                                            monkey_tail[current] = branch;
                                        }
                                    }else{
                                        monkey_count[--current]++;
                                    }
                                }
                            }
                        }
                    }
                }

                // at this point, vals contains the one directional surpluses
                for(int i=0; i<nump; i++){
                    const double *s = surpluses.getStrip(pnts[i]);
                    const double *c = scale.getStrip(pnts[i]);
                    const double *v = vals.getStrip(i);
                    bool small = true;
                    if (output == -1){
                        for(int k=0; k<num_outputs; k++){
                            small = small && (((c[k] * std::abs(s[k]) / norm[k]) <= tolerance) || ((c[k] * std::abs(v[k]) / norm[k]) <= tolerance));
                        }
                    }else{
                        small = ((c[0] * std::abs(s[output]) / norm[output]) <= tolerance) || ((c[0] * std::abs(v[0]) / norm[output]) <= tolerance);
                    }
                    pmap.getStrip(pnts[i])[d] = (small) ? 0 : 1;;
                }
            }
        }
    }
    return pmap;
}